

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O0

string * __thiscall Wiener::getParameter(string *__return_storage_ptr__,Wiener *this,string *name)

{
  bool bVar1;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream param;
  ostream local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  Wiener *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (Wiener *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = std::operator==(local_20,"mean");
  if (bVar1) {
    std::ostream::operator<<
              (&local_198,this->wienerMean / (this->wienerSqrtDt * this->wienerSqrtDt));
  }
  else {
    bVar1 = std::operator==(local_20,"variance");
    if (bVar1) {
      std::ostream::operator<<(&local_198,this->wienerStdDev * this->wienerStdDev);
    }
    else {
      Parametric::getParameter(&local_1d8,(Parametric *)this,local_20);
      std::operator<<(&local_198,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string Wiener::getParameter(const string& name) const
{
	stringstream param;
if (name == "mean")
		param << wienerMean / (wienerSqrtDt * wienerSqrtDt);
	else if (name == "variance")
		param << wienerStdDev*wienerStdDev;
	else
		param << StochasticVariable::getParameter(name);
		
	return param.str();
}